

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

bool __thiscall
ON_PhysicallyBasedMaterialUserData::Parameters::Write
          (Parameters *this,ON_BinaryArchive *binary_archive,int version)

{
  bool bVar1;
  int version_local;
  ON_BinaryArchive *binary_archive_local;
  Parameters *this_local;
  
  bVar1 = ON_BinaryArchive::WriteColor(binary_archive,&this->base_color);
  if (bVar1) {
    bVar1 = ON_BinaryArchive::WriteInt(binary_archive,this->brdf);
    if (bVar1) {
      bVar1 = ON_BinaryArchive::WriteDouble(binary_archive,this->subsurface);
      if (bVar1) {
        bVar1 = ON_BinaryArchive::WriteColor(binary_archive,&this->subsurface_scattering_color);
        if (bVar1) {
          bVar1 = ON_BinaryArchive::WriteDouble(binary_archive,this->subsurface_scattering_radius);
          if (bVar1) {
            bVar1 = ON_BinaryArchive::WriteDouble(binary_archive,this->metallic);
            if (bVar1) {
              bVar1 = ON_BinaryArchive::WriteDouble(binary_archive,this->specular);
              if (bVar1) {
                bVar1 = ON_BinaryArchive::WriteDouble(binary_archive,this->specular_tint);
                if (bVar1) {
                  bVar1 = ON_BinaryArchive::WriteDouble(binary_archive,this->roughness);
                  if (bVar1) {
                    bVar1 = ON_BinaryArchive::WriteDouble(binary_archive,this->anisotropic);
                    if (bVar1) {
                      bVar1 = ON_BinaryArchive::WriteDouble
                                        (binary_archive,this->anisotropic_rotation);
                      if (bVar1) {
                        bVar1 = ON_BinaryArchive::WriteDouble(binary_archive,this->sheen);
                        if (bVar1) {
                          bVar1 = ON_BinaryArchive::WriteDouble(binary_archive,this->sheen_tint);
                          if (bVar1) {
                            bVar1 = ON_BinaryArchive::WriteDouble(binary_archive,this->clearcoat);
                            if (bVar1) {
                              bVar1 = ON_BinaryArchive::WriteDouble
                                                (binary_archive,this->clearcoat_roughness);
                              if (bVar1) {
                                bVar1 = ON_BinaryArchive::WriteDouble
                                                  (binary_archive,this->opacity_IOR);
                                if (bVar1) {
                                  bVar1 = ON_BinaryArchive::WriteDouble
                                                    (binary_archive,this->opacity);
                                  if (bVar1) {
                                    bVar1 = ON_BinaryArchive::WriteDouble
                                                      (binary_archive,this->opacity_roughness);
                                    if (bVar1) {
                                      bVar1 = ON_BinaryArchive::WriteColor
                                                        (binary_archive,&this->emission);
                                      if (bVar1) {
                                        if ((version < 2) ||
                                           (bVar1 = ON_BinaryArchive::WriteDouble
                                                              (binary_archive,this->alpha), bVar1))
                                        {
                                          this_local._7_1_ = true;
                                        }
                                        else {
                                          this_local._7_1_ = false;
                                        }
                                      }
                                      else {
                                        this_local._7_1_ = false;
                                      }
                                    }
                                    else {
                                      this_local._7_1_ = false;
                                    }
                                  }
                                  else {
                                    this_local._7_1_ = false;
                                  }
                                }
                                else {
                                  this_local._7_1_ = false;
                                }
                              }
                              else {
                                this_local._7_1_ = false;
                              }
                            }
                            else {
                              this_local._7_1_ = false;
                            }
                          }
                          else {
                            this_local._7_1_ = false;
                          }
                        }
                        else {
                          this_local._7_1_ = false;
                        }
                      }
                      else {
                        this_local._7_1_ = false;
                      }
                    }
                    else {
                      this_local._7_1_ = false;
                    }
                  }
                  else {
                    this_local._7_1_ = false;
                  }
                }
                else {
                  this_local._7_1_ = false;
                }
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Write(ON_BinaryArchive& binary_archive, int version) const
    {
      if (!binary_archive.WriteColor(base_color)) return false;
      if (!binary_archive.WriteInt((int)brdf)) return false;
      if (!binary_archive.WriteDouble(subsurface)) return false;
      if (!binary_archive.WriteColor(subsurface_scattering_color)) return false;
      if (!binary_archive.WriteDouble(subsurface_scattering_radius)) return false;
      if (!binary_archive.WriteDouble(metallic)) return false;
      if (!binary_archive.WriteDouble(specular)) return false;
      if (!binary_archive.WriteDouble(specular_tint)) return false;
      if (!binary_archive.WriteDouble(roughness)) return false;
      if (!binary_archive.WriteDouble(anisotropic)) return false;
      if (!binary_archive.WriteDouble(anisotropic_rotation)) return false;
      if (!binary_archive.WriteDouble(sheen)) return false;
      if (!binary_archive.WriteDouble(sheen_tint)) return false;
      if (!binary_archive.WriteDouble(clearcoat)) return false;
      if (!binary_archive.WriteDouble(clearcoat_roughness)) return false;
      if (!binary_archive.WriteDouble(opacity_IOR)) return false;
      if (!binary_archive.WriteDouble(opacity)) return false;
      if (!binary_archive.WriteDouble(opacity_roughness)) return false;
      if (!binary_archive.WriteColor(emission)) return false;

      if (version >= 2)
      {
        if (!binary_archive.WriteDouble(alpha)) return false;
      }

      return true;
    }